

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.cc
# Opt level: O1

void __thiscall
absl::lts_20250127::strings_internal::BigUnsigned<4>::MultiplyStep
          (BigUnsigned<4> *this,int original_size,uint32_t *other_words,int other_size,int step)

{
  uint64_t value;
  uint uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = original_size - 1U;
  if (step <= (int)(original_size - 1U)) {
    uVar1 = step;
  }
  if ((int)(step - uVar1) < other_size && -1 < (int)uVar1) {
    uVar2 = (ulong)uVar1;
    value = 0;
    uVar6 = 0;
    lVar4 = (long)(int)(step - uVar1);
    do {
      lVar3 = lVar4 + 1;
      uVar5 = (ulong)other_words[lVar4] * (ulong)this->words_[uVar2] + uVar6;
      uVar6 = uVar5 & 0xffffffff;
      value = (uVar5 >> 0x20) + value;
      if ((long)uVar2 < 1) break;
      uVar2 = uVar2 - 1;
      lVar4 = lVar3;
    } while (lVar3 < other_size);
  }
  else {
    uVar6 = 0;
    value = 0;
  }
  AddWithCarry(this,step + 1,value);
  this->words_[step] = (uint32_t)uVar6;
  if ((uVar6 != 0) && (this->size_ <= step)) {
    this->size_ = step + 1;
  }
  return;
}

Assistant:

void BigUnsigned<max_words>::MultiplyStep(int original_size,
                                          const uint32_t* other_words,
                                          int other_size, int step) {
  int this_i = std::min(original_size - 1, step);
  int other_i = step - this_i;

  uint64_t this_word = 0;
  uint64_t carry = 0;
  for (; this_i >= 0 && other_i < other_size; --this_i, ++other_i) {
    uint64_t product = words_[this_i];
    product *= other_words[other_i];
    this_word += product;
    carry += (this_word >> 32);
    this_word &= 0xffffffff;
  }
  AddWithCarry(step + 1, carry);
  words_[step] = this_word & 0xffffffff;
  if (this_word > 0 && size_ <= step) {
    size_ = step + 1;
  }
}